

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.h
# Opt level: O2

void __thiscall
xLearn::Loss::Initialize
          (Loss *this,Score *score,ThreadPool *pool,bool norm,bool lock_free,index_t batch_size)

{
  ostream *poVar1;
  allocator local_4e;
  allocator local_4d;
  Logger local_4c;
  string local_48;
  string local_28;
  
  if (score == (Score *)0x0) {
    local_4c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.h"
               ,&local_4d);
    std::__cxx11::string::string((string *)&local_48,"Initialize",&local_4e);
    poVar1 = Logger::Start(ERR,&local_28,0x52,&local_48);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x52);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"score");
    std::operator<<(poVar1," == NULL \n");
  }
  else {
    if (pool != (ThreadPool *)0x0) {
      this->score_func_ = score;
      this->pool_ = pool;
      this->norm_ = norm;
      this->threadNumber_ =
           (long)(pool->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pool->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
      this->lock_free_ = lock_free;
      this->batch_size_ = batch_size;
      return;
    }
    local_4c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.h"
               ,&local_4d);
    std::__cxx11::string::string((string *)&local_48,"Initialize",&local_4e);
    poVar1 = Logger::Start(ERR,&local_28,0x53,&local_48);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x53);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"pool");
    std::operator<<(poVar1," == NULL \n");
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  Logger::~Logger(&local_4c);
  abort();
}

Assistant:

void Initialize(Score* score, 
                  ThreadPool* pool, 
                  bool norm = true,
                  bool lock_free = false,
                  index_t batch_size = 0) {
    CHECK_NOTNULL(score);
    CHECK_NOTNULL(pool);
    CHECK_GE(batch_size, 0);
    score_func_ = score;
    pool_ = pool;
    norm_ = norm;
    threadNumber_ = pool_->ThreadNumber();
    lock_free_ = lock_free;
    batch_size_ = batch_size;
  }